

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_LimitingInputStream_Test::TestBody
          (IoTest_LimitingInputStream_Test *this)

{
  int64_t limit;
  bool read_eof;
  ZeroCopyOutputStream *output_00;
  LimitingInputStream input;
  ArrayInputStream array_input;
  ArrayOutputStream output;
  uint8_t buffer [256];
  
  output_00 = (ZeroCopyOutputStream *)buffer;
  ArrayOutputStream::ArrayOutputStream(&output,(ZeroCopyOutputStream *)buffer,0x100,-1);
  IoTest::WriteStuff((IoTest *)&output,output_00);
  ArrayInputStream::ArrayInputStream(&array_input,(ZeroCopyOutputStream *)buffer,0x100,-1);
  limit = ArrayOutputStream::ByteCount(&output);
  LimitingInputStream::LimitingInputStream(&input,&array_input.super_ZeroCopyInputStream,limit);
  IoTest::ReadStuff((IoTest *)&input,(ZeroCopyInputStream *)0x1,read_eof);
  LimitingInputStream::~LimitingInputStream(&input);
  return;
}

Assistant:

TEST_F(IoTest, LimitingInputStream) {
  const int kBufferSize = 256;
  uint8_t buffer[kBufferSize];

  // Fill the buffer.
  ArrayOutputStream output(buffer, kBufferSize);
  WriteStuff(&output);

  // Set up input.
  ArrayInputStream array_input(buffer, kBufferSize);
  LimitingInputStream input(&array_input, output.ByteCount());

  ReadStuff(&input);
}